

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitions.c
# Opt level: O0

size_t inform_next_partitioning(size_t *xs,size_t size)

{
  size_t *psVar1;
  size_t *local_60;
  ulong local_58;
  size_t i;
  size_t *kt;
  size_t *jt;
  size_t *it;
  size_t *last;
  size_t *first;
  size_t n;
  size_t size_local;
  size_t *xs_local;
  
  first = (size_t *)0x0;
  if (1 < size) {
    psVar1 = xs + size;
    while (i = (size_t)psVar1, jt = (size_t *)(i + -8), jt != xs) {
      psVar1 = jt;
      if (*jt < size - 1) {
        for (kt = (size_t *)(i + -0x10); psVar1 = jt, kt != xs + -1; kt = kt + -1) {
          if (*kt == *jt) {
            *jt = *jt + 1;
            for (; (size_t *)i != xs + size; i = i + 8) {
              *(undefined8 *)i = 0;
            }
            for (local_58 = 0; local_58 < size; local_58 = local_58 + 1) {
              if (first < (size_t *)(xs[local_58] + 1)) {
                local_60 = (size_t *)(xs[local_58] + 1);
              }
              else {
                local_60 = first;
              }
              first = local_60;
            }
            return (size_t)first;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

size_t inform_next_partitioning(size_t *xs, size_t size)
{
    size_t n = 0;
    if (size > 1)
    {
        size_t *first = xs;
        size_t *last  = first + size;
        for (size_t *it = last - 1; it != first; --it)
        {
            if (*it < size - 1)
            {
                for (size_t *jt = it - 1; jt != first - 1; --jt)
                {
                    if (*jt == *it)
                    {
                        *it += 1;
                        for (size_t *kt = it + 1; kt != last; ++kt)
                        {
                            *kt = 0;
                        }
                        for (size_t i = 0; i < size; ++i)
                        {
                            n = (xs[i]+1 > n) ? xs[i]+1 : n;
                        }
                        return n;
                    }
                }
            }
        }
    }
    return n;
}